

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::BeginFunction(TypeChecker *this,TypeVector *sig)

{
  Label *__first;
  Label *__last;
  pointer pTVar1;
  pointer pTVar2;
  LabelType local_44;
  unsigned_long local_40;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  
  pTVar1 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar1) {
    (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1;
  }
  __first = (this->label_stack_).
            super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __last = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = pTVar1;
  if (__last != __first) {
    std::_Destroy_aux<false>::__destroy<wabt::TypeChecker::Label*>(__first,__last);
    (this->label_stack_).
    super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
    super__Vector_impl_data._M_finish = __first;
    pTVar1 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_start;
    pTVar2 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish;
  }
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_44 = First;
  local_40 = (long)pTVar2 - (long)pTVar1 >> 2;
  std::vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>>::
  emplace_back<wabt::LabelType&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,unsigned_long>
            ((vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>> *)
             &this->label_stack_,&local_44,&local_38,sig,&local_40);
  if (local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (Result)Ok;
}

Assistant:

Result TypeChecker::BeginFunction(const TypeVector& sig) {
  type_stack_.clear();
  label_stack_.clear();
  PushLabel(LabelType::Func, TypeVector(), sig);
  return Result::Ok;
}